

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<asl::Var> * __thiscall asl::Array<asl::Var>::insert(Array<asl::Var> *this,int k,Var *x)

{
  Var *pVVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  anon_union_8_8_7df20137_for_Var_3 aVar5;
  undefined4 uVar6;
  Var *pVVar7;
  undefined8 *puVar8;
  Var *extraout_RDX;
  Var *src;
  Var *extraout_RDX_00;
  Type TVar9;
  Var *pVVar10;
  int iVar11;
  
  pVVar10 = this->_a;
  TVar2 = pVVar10[-1]._type;
  iVar3 = *(int *)&pVVar10[-1].field_0x4;
  TVar9 = k;
  if (k < 0) {
    TVar9 = TVar2;
  }
  if ((int)TVar2 < iVar3) {
    pVVar7 = pVVar10 + -1;
    src = x;
LAB_0012c9b4:
    if (TVar2 - TVar9 != 0 && (int)TVar9 <= (int)TVar2) {
      memmove(pVVar10 + (long)(int)TVar9 + 1,pVVar10 + (int)TVar9,(long)(int)(TVar2 - TVar9) << 4);
      pVVar10 = this->_a;
      src = extraout_RDX_00;
    }
    uVar6 = *(undefined4 *)&x->field_0x4;
    aVar5 = x->field_1;
    pVVar1 = pVVar10 + (int)TVar9;
    pVVar1->_type = x->_type;
    *(undefined4 *)&pVVar1->field_0x4 = uVar6;
    pVVar1->field_1 = aVar5;
    if ((pVVar10[(int)TVar9]._type & STRING) != NONE) {
      Var::copy(pVVar10 + (int)TVar9,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)src);
    }
    pVVar7->_type = TVar2 + NUL;
    return this;
  }
  if (TVar2 != 0x7fffffff) {
    dup(this,k);
    iVar4 = this->_a[-1].field_1._i;
    iVar11 = 0x7fffffff;
    if (iVar3 < 0x3ffffffe) {
      iVar11 = iVar3 * 2 + 2;
    }
    pVVar7 = (Var *)realloc(this->_a + -1,(long)iVar11 * 0x10 + 0x10);
    if (pVVar7 != (Var *)0x0) {
      pVVar10 = pVVar7 + 1;
      this->_a = pVVar10;
      *(int *)&pVVar7->field_0x4 = iVar11;
      (pVVar7->field_1)._i = iVar4;
      src = extraout_RDX;
      goto LAB_0012c9b4;
    }
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = dup2;
  __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}